

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O0

bool __thiscall Box::intersect(Box *this,Ray *r,double *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_5c;
  int i;
  double vo;
  double vd;
  double t2;
  double t1;
  double tFar;
  double tNear;
  double *t_local;
  Ray *r_local;
  Box *this_local;
  
  BoxTestCount = BoxTestCount + 1;
  tFar = -INFINITY;
  t1 = INFINITY;
  local_5c = 0;
  do {
    if (2 < local_5c) {
      *t = tFar;
      if (*t <= geom_threshold) {
        BoxTestMisses = BoxTestMisses + 1;
      }
      this_local._7_1_ = *t > geom_threshold;
      return this_local._7_1_;
    }
    dVar3 = operator&(&r->dir,this->n + local_5c);
    dVar4 = operator&(&r->org,this->n + local_5c);
    if (dVar3 <= 0.01) {
      if (dVar3 < -0.01) {
        dVar1 = this->d1[local_5c];
        dVar2 = this->d2[local_5c];
        goto LAB_00108fe4;
      }
      if ((dVar4 < this->d1[local_5c]) ||
         (this->d2[local_5c] <= dVar4 && dVar4 != this->d2[local_5c])) {
        BoxTestMisses = BoxTestMisses + 1;
        return false;
      }
    }
    else {
      dVar1 = this->d2[local_5c];
      dVar2 = this->d1[local_5c];
LAB_00108fe4:
      t2 = -(dVar4 + dVar1) / dVar3;
      vd = -(dVar4 + dVar2) / dVar3;
      if (tFar < t2) {
        tFar = t2;
      }
      if ((vd < t1) && (t1 = vd, vd < geom_threshold)) {
        BoxTestMisses = BoxTestMisses + 1;
        return false;
      }
      if (t1 < tFar) {
        BoxTestMisses = BoxTestMisses + 1;
        return false;
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

bool Box::intersect(Ray& r, double& t)
{
    STAT(BoxTestCount++);

    double tNear = -INFINITY;
    double tFar  = INFINITY;
    double t1,t2;
    double vd,vo;
    int i;

    for( i = 0; i < 3; i++ )
    {
        vd = r.dir & n[i];
        vo = r.org & n[i];

        if( vd > EPS )
        {
            t1 = -(vo + d2[i]) / vd;
            t2 = -(vo + d1[i]) / vd;
        }
        else
        if(vd < -EPS)
        {
            t1 = -(vo + d1[i]) / vd;
            t2 = -(vo + d2[i]) / vd;
        }
        else // ray is parallel to slab
        {
            if( vo < d1[i] || vo > d2[i] )
            {
                STAT(BoxTestMisses++);
                return false;
            }
            else
                continue;
        }
        if( t1 > tNear )
            tNear = t1;
        if( t2 < tFar )
            if( (tFar = t2) < geom_threshold )
            {
                STAT(BoxTestMisses++);
                return false;
            }
        if( tNear > tFar )
        {
            STAT(BoxTestMisses++);
            return false;
        }
    }
    t = tNear;
    if( t > geom_threshold )
        return true;
    else
    {
        STAT(BoxTestMisses++);
        return false;
    }
}